

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
webots_velocity_message_write_read::test_method(webots_velocity_message_write_read *this)

{
  buffer_reader *reader_00;
  shared_count *this_00;
  assertion_result local_150;
  webots_velocity_message local_138;
  char *local_128;
  char *local_120;
  webots_velocity_message read_msg;
  buffer buffer;
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_e8;
  buffer_writer writer;
  buffer_reader reader;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  lazy_ostream local_70;
  undefined1 *local_60;
  char **local_58;
  const_string local_50;
  const_string local_40;
  
  local_138.left_speed = 4.1;
  local_138.right_speed = 2.5;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_writer::buffer_writer(&writer,&buffer);
  ::operator<<(&writer,&local_138);
  buffer_reader::buffer_reader(&reader,&buffer);
  reader_00 = &reader;
  ::operator>>(reader_00,&read_msg);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)reader_00,&local_40,0xa0,&local_50);
  local_e8.m_rhs = &local_138.right_speed;
  local_e8.m_lhs.m_value = &read_msg.right_speed;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  ::evaluate(&local_150,&local_e8,false);
  local_128 = "read_msg.right_speed == write_msg.right_speed";
  local_120 = "";
  local_70.m_empty = false;
  local_70._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_80.m_end = "";
  local_58 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_70,&local_80,0xa0,CHECK,CHECK_BUILT_ASSERTION,0);
  this_00 = &local_150.m_message.pn;
  boost::detail::shared_count::~shared_count(this_00);
  local_90.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_90.m_end = "";
  local_a0.m_begin = "";
  local_a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_90,0xa1,&local_a0);
  local_e8.m_lhs.m_value = &read_msg.left_speed;
  local_e8.m_rhs = &local_138.left_speed;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  ::evaluate(&local_150,&local_e8,false);
  local_128 = "read_msg.left_speed == write_msg.left_speed";
  local_120 = "";
  local_70.m_empty = false;
  local_70._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_b0.m_end = "";
  local_58 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_70,&local_b0,0xa1,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(webots_velocity_message_write_read)
{
    webots_velocity_message write_msg;
    write_msg.right_speed = 2.5;
    write_msg.left_speed = 4.1;

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    webots_velocity_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    BOOST_TEST(read_msg.right_speed == write_msg.right_speed);
    BOOST_TEST(read_msg.left_speed == write_msg.left_speed);
}